

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_714a8::AssertUint128Equals(anon_unknown_dwarf_714a8 *this,v128 expected,char *s)

{
  bool bVar1;
  size_t sVar2;
  Message *message;
  char *pcVar3;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_60;
  Message local_58;
  Result local_50;
  Enum local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  v128 actual;
  char *end;
  char *s_local;
  v128 expected_local;
  
  pcVar3 = expected.v._8_8_;
  expected_local.v._0_8_ = expected.v._0_8_;
  end = pcVar3;
  s_local = (char *)this;
  sVar2 = strlen(pcVar3);
  local_4c = Ok;
  local_50 = wabt::ParseUint128(end,pcVar3 + sVar2,(v128 *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<wabt::Result::Enum,_wabt::Result,_nullptr>
            ((EqHelper *)local_48,"Result::Ok","ParseUint128(s, end, &actual)",&local_4c,&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    message = testing::Message::operator<<(&local_58,&end);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-literal.cc"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,message);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(&local_58);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::internal::EqHelper::Compare<v128,_v128,_nullptr>
              ((EqHelper *)local_78,"expected","actual",(v128 *)&s_local,(v128 *)&gtest_ar.message_)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
    if (!bVar1) {
      testing::Message::Message(&local_80);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-literal.cc"
                 ,0x5f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      testing::Message::~Message(&local_80);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  }
  return;
}

Assistant:

void AssertUint128Equals(v128 expected, const char* s) {
  const char* const end = s + strlen(s);
  v128 actual;
  ASSERT_EQ(Result::Ok, ParseUint128(s, end, &actual)) << s;
  ASSERT_EQ(expected, actual);
}